

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall SQCompilation::CodegenVisitor::visitCallExpr(CodegenVisitor *this,CallExpr *call)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  TreeOp TVar3;
  uint uVar4;
  Expr **ppEVar5;
  Node *n;
  SQInteger arg3;
  SQInteger SVar6;
  SQInteger SVar7;
  SQInteger SVar8;
  undefined1 uVar9;
  long lVar10;
  SQOpcode SVar11;
  CodegenVisitor *this_00;
  SQFuncState *pSVar12;
  ulong arg3_00;
  ulong uVar13;
  bool local_49;
  SQObject local_48;
  SQInteger local_38;
  
  this_00 = this;
  maybeAddInExprLine(this,&call->super_Expr);
  n = &deparen(this_00,call->_callee)->super_Node;
  if (n->_op == TO_GETFIELD) {
    uVar9 = (undefined1)n[1]._op;
  }
  else {
    uVar9 = TO_BLOCK;
  }
  bVar2 = call->_nullable;
  visitNoGet(this,n);
  TVar3 = n->_op;
  if (TVar3 - TO_GETFIELD < 4) {
    if (*(int *)(n[1].super_ArenaObj._vptr_ArenaObj + 3) == 0x3a) goto LAB_0015a938;
LAB_0015a7f5:
    pSVar12 = this->_fs;
    if ((uVar9 == TO_BLOCK && bVar2 == false) && ((pSVar12->lang_features & 0x800) == 0)) {
      SVar7 = SQFuncState::PopTarget(pSVar12);
      SVar8 = SQFuncState::PopTarget(this->_fs);
      SVar6 = SQFuncState::PushTarget(this->_fs,-1);
      arg3 = SQFuncState::PushTarget(this->_fs,-1);
      pSVar12 = this->_fs;
      SVar11 = _OP_PREPCALL;
      goto LAB_0015a9c6;
    }
    SVar7 = SQFuncState::GetUpTarget(pSVar12,1);
    SVar6 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(this->_fs,_OP_MOVE,SVar6,SVar7,0,0);
    SQFuncState::PopTarget(this->_fs);
    if (uVar9 == TO_BLOCK) {
      uVar13 = (ulong)((this->_fs->lang_features & 0x800) == 0);
    }
    else {
      uVar13 = 8;
    }
    arg3_00 = uVar13 | 2;
    if (bVar2 == false) {
      arg3_00 = uVar13;
    }
    local_38 = SVar6;
    SVar7 = SQFuncState::PopTarget(this->_fs);
    SVar6 = SQFuncState::PopTarget(this->_fs);
    pSVar12 = this->_fs;
    SVar8 = SQFuncState::PushTarget(pSVar12,-1);
    SQFuncState::AddInstruction(pSVar12,_OP_GET,SVar8,SVar7,SVar6,arg3_00);
    SVar6 = SQFuncState::PushTarget(this->_fs,-1);
    pSVar12 = this->_fs;
    SVar7 = local_38;
  }
  else {
    if (TVar3 == TO_ROOT_TABLE_ACCESS) goto LAB_0015a7f5;
    if (TVar3 == TO_ID) {
      pSVar12 = this->_fs;
      local_48 = SQFuncState::CreateString(pSVar12,(SQChar *)n[1].super_ArenaObj._vptr_ArenaObj,-1);
      if ((local_48._type >> 0x1b & 1) != 0) {
        pSVar1 = &((local_48._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      local_49 = false;
      SVar7 = SQFuncState::GetOuterVariable(pSVar12,&local_48,&local_49);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
      if (SVar7 == -1) goto LAB_0015a938;
      pSVar12 = this->_fs;
      SVar6 = SQFuncState::PushTarget(pSVar12,-1);
      SQFuncState::AddInstruction(pSVar12,_OP_GETOUTER,SVar6,SVar7,0,0);
      pSVar12 = this->_fs;
    }
    else {
LAB_0015a938:
      pSVar12 = this->_fs;
    }
    SVar6 = SQFuncState::PushTarget(pSVar12,-1);
    SVar7 = 0;
  }
  SVar11 = _OP_MOVE;
  SVar8 = 0;
  arg3 = 0;
LAB_0015a9c6:
  SQFuncState::AddInstruction(pSVar12,SVar11,SVar6,SVar7,SVar8,arg3);
  uVar13 = 0xffffffffffffffff;
  ppEVar5 = (call->_args)._vals;
  uVar4 = (call->_args)._size;
  for (lVar10 = 0; (ulong)uVar4 << 3 != lVar10; lVar10 = lVar10 + 8) {
    Node::visit<SQCompilation::CodegenVisitor>(*(Node **)((long)ppEVar5 + lVar10),this);
    MoveIfCurrentTargetIsLocal(this);
  }
  do {
    uVar4 = (call->_args)._size;
    SVar7 = SQFuncState::PopTarget(this->_fs);
    uVar13 = uVar13 + 1;
  } while (uVar13 < uVar4);
  SVar6 = SQFuncState::PopTarget(this->_fs);
  SVar8 = SQFuncState::PushTarget(this->_fs,-1);
  SVar11 = _OP_CALL;
  if (bVar2 != false) {
    SVar11 = _OP_NULLCALL;
  }
  SQFuncState::AddInstruction(this->_fs,SVar11,SVar8,SVar6,SVar7,(ulong)((call->_args)._size + 1));
  return;
}

Assistant:

void CodegenVisitor::visitCallExpr(CallExpr *call) {
    maybeAddInExprLine(call);

    Expr *callee = deparen(call->callee());
    bool isNullCall = call->isNullable();
    bool isTypeMethod = false;
    if (callee->op() == TO_GETFIELD) {
        isTypeMethod = callee->asGetField()->isTypeMethod();
    }

    visitNoGet(callee);

    SQInteger outerPos = -1;

    if (isCalleeAnObject(callee)) {
        if (!isNullCall && !isTypeMethod && ((_fs->lang_features & LF_FORBID_IMPLICIT_DEF_DELEGATE) == 0)) {
            SQInteger key = _fs->PopTarget();  /* location of the key */
            SQInteger table = _fs->PopTarget();  /* location of the object */
            SQInteger closure = _fs->PushTarget(); /* location for the closure */
            SQInteger ttarget = _fs->PushTarget(); /* location for 'this' pointer */
            _fs->AddInstruction(_OP_PREPCALL, closure, key, table, ttarget);
        }
        else {
            SQInteger self = _fs->GetUpTarget(1);  /* location of the object */
            SQInteger storedSelf = _fs->PushTarget();
            _fs->AddInstruction(_OP_MOVE, storedSelf, self);
            _fs->PopTarget();
            SQInteger flags = 0;
            if (isTypeMethod) {
                flags |= OP_GET_FLAG_TYPE_METHODS_ONLY;
            } else if ((_fs->lang_features & LF_FORBID_IMPLICIT_DEF_DELEGATE) == 0) {
                flags |= OP_GET_FLAG_ALLOW_DEF_DELEGATE;
            }
            if (isNullCall)
              flags |= OP_GET_FLAG_NO_ERROR;

            SQInteger key = _fs->PopTarget();
            SQInteger src = _fs->PopTarget();
            _fs->AddInstruction(_OP_GET, _fs->PushTarget(), key, src, flags);
            SQInteger ttarget = _fs->PushTarget();
            _fs->AddInstruction(_OP_MOVE, ttarget, storedSelf);
        }
    }
    else if (isCalleeAnOuter(_fs, callee, outerPos)) {
        _fs->AddInstruction(_OP_GETOUTER, _fs->PushTarget(), outerPos);
        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
    }
    else {
        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
    }

    const auto &args = call->arguments();

    for (auto arg : args) {
        arg->visit(this);
        MoveIfCurrentTargetIsLocal();
    }

    for (SQUnsignedInteger i = 0; i < args.size(); ++i) {
        _fs->PopTarget();
    }

    SQInteger stackbase = _fs->PopTarget();
    SQInteger closure = _fs->PopTarget();
    SQInteger target = _fs->PushTarget();
    assert(target >= -1);
    assert(target < 255);
    _fs->AddInstruction(isNullCall ? _OP_NULLCALL : _OP_CALL, target, closure, stackbase, args.size() + 1);
}